

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
          (cmGeneratorTarget *this,string *p,string *config)

{
  TargetType TVar1;
  CompatibleInterfacesBase *pCVar2;
  const_iterator cVar3;
  bool bVar4;
  
  TVar1 = this->Target->TargetTypeValue;
  bVar4 = false;
  if ((TVar1 != OBJECT_LIBRARY) && (TVar1 != INTERFACE_LIBRARY)) {
    pCVar2 = GetCompatibleInterfaces(this,config);
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(pCVar2->PropsString)._M_t,p);
    bVar4 = (_Rb_tree_header *)cVar3._M_node !=
            &(pCVar2->PropsString)._M_t._M_impl.super__Rb_tree_header;
  }
  return bVar4;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}